

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O1

void libcellml::findAndReplaceComponentsCnUnitsNames
               (ComponentPtr *component,string *oldName,string *newName)

{
  size_t sVar1;
  ulong uVar2;
  ComponentPtr childComponent;
  ComponentEntity CStack_38;
  
  findAndReplaceComponentCnUnitsNames(component,oldName,newName);
  sVar1 = ComponentEntity::componentCount
                    (&((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_ComponentEntity);
  if (sVar1 != 0) {
    uVar2 = 0;
    do {
      ComponentEntity::component
                (&CStack_38,
                 (size_t)(component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      findAndReplaceComponentCnUnitsNames((ComponentPtr *)&CStack_38,oldName,newName);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          CStack_38.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CStack_38.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
      }
      uVar2 = uVar2 + 1;
      sVar1 = ComponentEntity::componentCount
                        (&((component->
                           super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->super_ComponentEntity);
    } while (uVar2 < sVar1);
  }
  return;
}

Assistant:

void findAndReplaceComponentsCnUnitsNames(const ComponentPtr &component, const std::string &oldName, const std::string &newName)
{
    findAndReplaceComponentCnUnitsNames(component, oldName, newName);
    for (size_t index = 0; index < component->componentCount(); ++index) {
        auto childComponent = component->component(index);
        findAndReplaceComponentCnUnitsNames(childComponent, oldName, newName);
    }
}